

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenBreak(BinaryenModuleRef module,char *name,BinaryenExpressionRef condition,
             BinaryenExpressionRef value)

{
  IString *this;
  Break *this_00;
  undefined1 reuse;
  string_view sVar1;
  
  reuse = SUB81(value,0);
  this = (IString *)strlen(name);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)name;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)reuse);
  this_00 = (Break *)MixedArena::allocSpace(&module->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (this_00->name).super_IString.str = sVar1;
  this_00->value = value;
  this_00->condition = condition;
  wasm::Break::finalize(this_00);
  return (BinaryenExpressionRef)this_00;
}

Assistant:

BinaryenExpressionRef BinaryenBreak(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef condition,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBreak(name, (Expression*)value, (Expression*)condition));
}